

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlemgr.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSimpleHandleManager::FreeHandle(CSimpleHandleManager *this,CPalThread *pThread,HANDLE h)

{
  bool bVar1;
  HANDLE_TABLE_ENTRY *pHVar2;
  IPalObject *pIVar3;
  PAL_ERROR PVar4;
  HANDLE_INDEX HVar5;
  
  InternalEnterCriticalSection(pThread,&this->m_csLock);
  bVar1 = ValidateHandle(this,h);
  if (bVar1) {
    if (((long)h - 0xffffff01U < 5) && ((0x15UL >> ((long)h - 0xffffff01U & 0x3f) & 1) != 0)) {
      pIVar3 = (IPalObject *)0x0;
      fprintf(_stderr,"] %s %s:%d","FreeHandle",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/handlemgr/handlemgr.cpp"
              ,0xe3);
      fprintf(_stderr,"Trying to free Special Handle %p.\n",h);
      PVar4 = 6;
    }
    else {
      HVar5 = ((ulong)h >> 2) - 1;
      pHVar2 = this->m_rghteHandleTable;
      pIVar3 = pHVar2[HVar5].u.pObject;
      pHVar2[HVar5].fEntryAllocated = false;
      pHVar2 = pHVar2 + this->m_hiFreeListEnd;
      if (this->m_hiFreeListEnd == 0xffffffffffffffff) {
        pHVar2 = (HANDLE_TABLE_ENTRY *)&this->m_hiFreeListStart;
      }
      (pHVar2->u).hiNextIndex = HVar5;
      this->m_rghteHandleTable[HVar5].u.hiNextIndex = 0xffffffffffffffff;
      this->m_hiFreeListEnd = HVar5;
      PVar4 = 0;
    }
  }
  else {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    PVar4 = 6;
    pIVar3 = (IPalObject *)0x0;
  }
  InternalLeaveCriticalSection(pThread,&this->m_csLock);
  if (pIVar3 != (IPalObject *)0x0) {
    (*pIVar3->_vptr_IPalObject[8])(pIVar3,pThread);
  }
  return PVar4;
}

Assistant:

PAL_ERROR
CSimpleHandleManager::FreeHandle(
    CPalThread *pThread,
    HANDLE h
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj = NULL;
    HANDLE_INDEX hi = HandleToHandleIndex(h);

    Lock(pThread);

    if (!ValidateHandle(h))
    {
        ERROR("Trying to free invalid handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    if (HandleIsSpecial(h))
    {
        ASSERT("Trying to free Special Handle %p.\n", h);
        palError = ERROR_INVALID_HANDLE;
        goto FreeHandleExit;
    }

    pobj = m_rghteHandleTable[hi].u.pObject;
    m_rghteHandleTable[hi].fEntryAllocated = FALSE;

    /* add handle to the free pool */
    if(m_hiFreeListEnd != c_hiInvalid)
    {
        m_rghteHandleTable[m_hiFreeListEnd].u.hiNextIndex = hi;
    }
    else
    {
        m_hiFreeListStart = hi;
    }
    
    m_rghteHandleTable[hi].u.hiNextIndex = c_hiInvalid;
    m_hiFreeListEnd = hi;

FreeHandleExit:    

    Unlock(pThread);

    if (NULL != pobj)
    {
        pobj->ReleaseReference(pThread);
    }

    return palError;
}